

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

int Gia_ObjRecognizeExor(Gia_Obj_t *pObj,Gia_Obj_t **ppFan0,Gia_Obj_t **ppFan1)

{
  ulong uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong *puVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  Gia_Obj_t *pObj_00;
  
  if (((ulong)pObj & 1) == 0) {
    uVar8 = (uint)*(ulong *)pObj;
    uVar7 = *(ulong *)pObj & 0x1fffffff;
    iVar5 = 0;
    iVar6 = 0;
    if (uVar7 != 0x1fffffff && -1 < (int)uVar8) {
      iVar2 = Gia_ObjIsBuf(pObj);
      if ((iVar2 == 0) && (iVar6 = iVar5, (uVar8 >> 0x1d & 1) != 0)) {
        pGVar3 = Gia_ObjChild1(pObj);
        if (((ulong)pGVar3 & 1) != 0) {
          pObj_00 = pObj + -uVar7;
          uVar7 = *(ulong *)pObj_00;
          if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
            puVar4 = (ulong *)((ulong)pGVar3 & 0xfffffffffffffffe);
            uVar1 = *puVar4;
            if (((((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) &&
                 (pObj_00 + -(uVar7 & 0x1fffffff) ==
                  (Gia_Obj_t *)((uVar1 & 0x1fffffff) * -0xc + (long)puVar4))) &&
                (pObj_00 + -(uVar7 >> 0x20 & 0x1fffffff) ==
                 (Gia_Obj_t *)((long)puVar4 + (uVar1 >> 0x20 & 0x1fffffff) * -0xc))) &&
               ((~(uVar1 ^ uVar7) & 0x2000000020000000) == 0)) {
              if (ppFan0 != (Gia_Obj_t **)0x0) {
                *ppFan0 = (Gia_Obj_t *)
                          ((ulong)((uint)(uVar7 >> 0x1d) & 1) |
                          (ulong)(pObj_00 + -(uVar7 & 0x1fffffff)));
              }
              iVar6 = 1;
              if (ppFan1 != (Gia_Obj_t **)0x0) {
                pGVar3 = Gia_ObjChild1(pObj_00);
                *ppFan1 = pGVar3;
              }
            }
          }
        }
      }
    }
    return iVar6;
  }
  __assert_fail("!Gia_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x3ad,"int Gia_ObjRecognizeExor(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
}

Assistant:

int Gia_ObjRecognizeExor( Gia_Obj_t * pObj, Gia_Obj_t ** ppFan0, Gia_Obj_t ** ppFan1 )
{
    Gia_Obj_t * p0, * p1;
    assert( !Gia_IsComplement(pObj) );
    if ( !Gia_ObjIsAnd(pObj) || Gia_ObjIsBuf(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    p0 = Gia_ObjChild0(pObj);
    p1 = Gia_ObjChild1(pObj);
    if ( !Gia_IsComplement(p0) || !Gia_IsComplement(p1) )
        return 0;
    p0 = Gia_Regular(p0);
    p1 = Gia_Regular(p1);
    if ( !Gia_ObjIsAnd(p0) || !Gia_ObjIsAnd(p1) )
        return 0;
    if ( Gia_ObjFanin0(p0) != Gia_ObjFanin0(p1) || Gia_ObjFanin1(p0) != Gia_ObjFanin1(p1) )
        return 0;
    if ( Gia_ObjFaninC0(p0) == Gia_ObjFaninC0(p1) || Gia_ObjFaninC1(p0) == Gia_ObjFaninC1(p1) )
        return 0;
    if ( ppFan0 ) *ppFan0 = Gia_ObjChild0(p0);
    if ( ppFan1 ) *ppFan1 = Gia_ObjChild1(p0);
    return 1;
}